

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_dr_flac *
ma_dr_flac_open_memory_with_metadata
          (void *pData,size_t dataSize,ma_dr_flac_meta_proc onMeta,void *pUserData,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_dr_flac_bs *pmVar1;
  ma_dr_flac *pmVar2;
  ma_dr_flac__memory_stream memoryStream;
  
  memoryStream.currentReadPos = 0;
  memoryStream.data = (ma_uint8 *)pData;
  memoryStream.dataSize = dataSize;
  pmVar2 = ma_dr_flac_open_with_metadata_private
                     (ma_dr_flac__on_read_memory,ma_dr_flac__on_seek_memory,onMeta,
                      ma_dr_flac_container_unknown,&memoryStream,pUserData,pAllocationCallbacks);
  if (pmVar2 != (ma_dr_flac *)0x0) {
    (pmVar2->memoryStream).currentReadPos = memoryStream.currentReadPos;
    (pmVar2->memoryStream).data = memoryStream.data;
    (pmVar2->memoryStream).dataSize = memoryStream.dataSize;
    if (pmVar2->container == ma_dr_flac_container_ogg) {
      pmVar1 = (ma_dr_flac_bs *)pmVar2->_oggbs;
    }
    else {
      pmVar1 = &pmVar2->bs;
    }
    pmVar1->pUserData = &pmVar2->memoryStream;
  }
  return pmVar2;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_memory_with_metadata(const void* pData, size_t dataSize, ma_dr_flac_meta_proc onMeta, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac__memory_stream memoryStream;
    ma_dr_flac* pFlac;
    memoryStream.data = (const ma_uint8*)pData;
    memoryStream.dataSize = dataSize;
    memoryStream.currentReadPos = 0;
    pFlac = ma_dr_flac_open_with_metadata_private(ma_dr_flac__on_read_memory, ma_dr_flac__on_seek_memory, onMeta, ma_dr_flac_container_unknown, &memoryStream, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    pFlac->memoryStream = memoryStream;
#ifndef MA_DR_FLAC_NO_OGG
    if (pFlac->container == ma_dr_flac_container_ogg)
    {
        ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pFlac->_oggbs;
        oggbs->pUserData = &pFlac->memoryStream;
    }
    else
#endif
    {
        pFlac->bs.pUserData = &pFlac->memoryStream;
    }
    return pFlac;
}